

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_XPM_Image.cxx
# Opt level: O3

void __thiscall Fl_XPM_Image::Fl_XPM_Image(Fl_XPM_Image *this,char *name)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  FILE *__stream;
  char **__dest;
  char *pcVar5;
  bool bVar6;
  byte *pbVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  byte *pbVar11;
  byte *__s;
  long lVar12;
  byte *pbVar13;
  int ncolors;
  int chars_per_pixel;
  int H;
  int W;
  char buffer [2068];
  int local_888;
  int local_884;
  Fl_Pixmap *local_880;
  char **local_878;
  int local_86c;
  int local_868;
  int local_864;
  FILE *local_860;
  ulong local_858;
  ulong local_850;
  byte local_848 [2068];
  undefined1 local_34 [4];
  
  Fl_Pixmap::Fl_Pixmap(&this->super_Fl_Pixmap,(char **)0x0);
  (this->super_Fl_Pixmap).super_Fl_Image._vptr_Fl_Image = (_func_int **)&PTR__Fl_Pixmap_0027a148;
  __stream = (FILE *)fl_fopen(name,"rb");
  if (__stream == (FILE *)0x0) {
    return;
  }
  local_880 = &this->super_Fl_Pixmap;
  __dest = (char **)operator_new__(0x800);
  local_858 = ~(ulong)local_848;
  local_888 = 0x100;
  uVar10 = 0;
  local_860 = __stream;
  while( true ) {
    pbVar13 = local_848;
    pcVar5 = fgets((char *)pbVar13,0x814,__stream);
    if (pcVar5 == (char *)0x0) break;
    if (local_848[0] == 0x22) {
      local_878 = __dest;
      local_850 = uVar10;
      if (local_848[1] != 0x22) {
        pbVar13 = local_848;
        pbVar7 = local_848 + 1;
        lVar12 = 0;
        bVar2 = local_848[1];
        do {
          __s = pbVar7 + 1;
          if (bVar2 == 0x5c) {
            bVar2 = *__s;
            if (bVar2 < 0xd) {
              if (bVar2 != 0) {
                if (bVar2 != 10) goto LAB_001de320;
LAB_001de37d:
                fgets((char *)__s,(int)local_34 - (int)__s,__stream);
              }
            }
            else if (bVar2 == 0x78) {
              pbVar11 = pbVar7 + 2;
              iVar3 = 0;
              bVar1 = true;
              do {
                bVar6 = bVar1;
                bVar2 = (byte)iVar3;
                iVar4 = hexdigit((int)(char)*pbVar11);
                __s = pbVar11;
                if (0xf < iVar4) break;
                pbVar11 = pbVar11 + 1;
                iVar3 = iVar3 * 0x10 + iVar4;
                bVar2 = (byte)iVar3;
                __s = pbVar7 + 4;
                bVar1 = false;
              } while (bVar6);
              lVar12 = lVar12 + 1;
              *pbVar13 = bVar2;
              __stream = local_860;
            }
            else {
              if (bVar2 == 0xd) goto LAB_001de37d;
LAB_001de320:
              pbVar11 = pbVar7 + 2;
              __s = pbVar11;
              if ((bVar2 & 0xf8) == 0x30) {
                uVar9 = (uint)(byte)(bVar2 - 0x30);
                bVar1 = true;
                do {
                  bVar6 = bVar1;
                  bVar2 = (byte)uVar9;
                  iVar3 = hexdigit((int)(char)*pbVar11);
                  __stream = local_860;
                  __s = pbVar11;
                  if (7 < iVar3) break;
                  pbVar11 = pbVar11 + 1;
                  uVar9 = iVar3 + uVar9 * 8;
                  bVar2 = (byte)uVar9;
                  __s = pbVar7 + 4;
                  bVar1 = false;
                } while (bVar6);
              }
              lVar12 = lVar12 + 1;
              *pbVar13 = bVar2;
            }
          }
          else {
            lVar12 = lVar12 + 1;
            *pbVar13 = bVar2;
          }
          pbVar7 = __s;
          pbVar13 = local_848 + lVar12;
          bVar2 = *pbVar7;
        } while ((bVar2 != 0x22) && (lVar12 < 0x800));
      }
      uVar10 = local_850;
      *pbVar13 = 0;
      lVar12 = (long)local_888;
      __dest = local_878;
      if (lVar12 <= (long)local_850) {
        uVar8 = lVar12 * 8 + 0x800;
        if (local_888 < -0x100) {
          uVar8 = 0xffffffffffffffff;
        }
        __dest = (char **)operator_new__(uVar8);
        local_888 = local_888 + 0x100;
        memcpy(__dest,local_878,lVar12 << 3);
        if (local_878 != (char **)0x0) {
          operator_delete__(local_878);
        }
      }
      if ((uVar10 == 0) &&
         (iVar3 = __isoc99_sscanf(local_848,"%d%d%d%d",&local_864,&local_868,&local_884,&local_86c),
         iVar3 < 4)) goto LAB_001de597;
      iVar3 = local_884;
      if (local_884 < 0) {
        iVar3 = 1;
      }
      if (((long)iVar3 < (long)uVar10) &&
         ((long)(pbVar13 + local_858 + 1) < (long)local_864 * (long)local_86c)) goto LAB_001de54b;
      pbVar13 = pbVar13 + (1 - (long)local_848);
      iVar3 = local_884 * -4;
      if (-1 < local_884) {
        iVar3 = local_86c;
      }
      if ((long)pbVar13 <= (long)iVar3) goto LAB_001de54b;
      pcVar5 = (char *)operator_new__((ulong)(pbVar13 + 1));
      __dest[uVar10] = pcVar5;
      memcpy(pcVar5,local_848,(size_t)pbVar13);
      __dest[uVar10][(long)pbVar13] = '\0';
      uVar10 = uVar10 + 1;
      this = (Fl_XPM_Image *)local_880;
    }
  }
  fclose(__stream);
  if (uVar10 == 0) {
    __stream = (FILE *)0x0;
LAB_001de597:
    if (__dest == (char **)0x0) goto LAB_001de5a7;
  }
  else {
    iVar3 = 2;
    if (-1 < local_884) {
      iVar3 = local_884 + 1;
    }
    if (iVar3 + local_868 <= (int)uVar10) {
      (this->super_Fl_Pixmap).super_Fl_Image.data_ = __dest;
      (this->super_Fl_Pixmap).super_Fl_Image.count_ = (int)uVar10;
      (this->super_Fl_Pixmap).alloc_data = 1;
      Fl_Pixmap::measure(&this->super_Fl_Pixmap);
      return;
    }
    __stream = (FILE *)0x0;
LAB_001de54b:
    if ((int)uVar10 == 0) goto LAB_001de597;
    uVar10 = (uVar10 & 0xffffffff) + 1;
    do {
      if (__dest[uVar10 - 2] != (char *)0x0) {
        operator_delete__(__dest[uVar10 - 2]);
      }
      uVar10 = uVar10 - 1;
    } while (1 < uVar10);
  }
  operator_delete__(__dest);
LAB_001de5a7:
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  return;
}

Assistant:

Fl_XPM_Image::Fl_XPM_Image(const char *name) : Fl_Pixmap((char *const*)0) {
  FILE *f;

  if ((f = fl_fopen(name, "rb")) == NULL) return;

  // read all the c-strings out of the file:
  char** new_data = new char *[INITIALLINES];
  char** temp_data;
  int malloc_size = INITIALLINES;
  char buffer[MAXSIZE+20];
  int i = 0;
  int W,H,ncolors,chars_per_pixel;
  while (fgets(buffer,MAXSIZE+20,f)) {
    if (buffer[0] != '\"') continue;
    char *myp = buffer;
    char *q = buffer+1;
    while (*q != '\"' && myp < buffer+MAXSIZE) {
      if (*q == '\\') switch (*++q) {
      case '\r':
      case '\n':
	if (!fgets(q,(int) (buffer+MAXSIZE+20-q),f)) { /* no problem if we hit EOF */ } break;
      case 0:
	break;
      case 'x': {
	q++;
	int n = 0;
	for (int x = 0; x < 2; x++) {
	  int xd = hexdigit(*q);
	  if (xd > 15) break;
	  n = (n<<4)+xd;
	  q++;
	}
	*myp++ = n;
      } break;
      default: {
	int c = *q++;
	if (c>='0' && c<='7') {
	  c -= '0';
	  for (int x=0; x<2; x++) {
	    int xd = hexdigit(*q);
	    if (xd>7) break;
	    c = (c<<3)+xd;
	    q++;
	  }
	}
	*myp++ = c;
      } break;
      } else {
	*myp++ = *q++;
      }
    }
    *myp++ = 0;
    if (i >= malloc_size) {
      temp_data = new char *[malloc_size + INITIALLINES];
      memcpy(temp_data, new_data, sizeof(char *) * malloc_size);
      delete[] new_data;
      new_data = temp_data;
      malloc_size += INITIALLINES;
    }
    // first line has 4 ints: width, height, ncolors, chars_per_pixel
    // followed by color segment: 
    //   if ncolors < 0 this is FLTK (non standard) compressed colormap - all colors coded in single line of 4*ncolors bytes
    //   otherwise - ncolor lines of at least chars_per_pixel bytes
    // followed by pic segment: H lines of at least chars_per_pixel*W bytes
    // next line: would have loved to use measure_pixmap, but it doesn't return all the data!
    if ((!i) && (sscanf(buffer,"%d%d%d%d", &W, &H, &ncolors, &chars_per_pixel) < 4)) goto bad_data; // first line
    else if ((i > (ncolors<0?1:ncolors)) && (myp-buffer-1<W*chars_per_pixel)) goto bad_data; // pic segment
    else if (myp-buffer-1<(ncolors<0?-ncolors*4:chars_per_pixel)) goto bad_data; // color segment
    new_data[i] = new char[myp-buffer+1];
    memcpy(new_data[i], buffer,myp-buffer);
    new_data[i][myp-buffer] = 0;
    i++;
  }

  fclose(f);
  f = NULL;
  if ((!i) || (i<1+(ncolors<0?1:ncolors)+H)) goto bad_data;
  data((const char **)new_data, i);
  alloc_data = 1;

  measure();
  return;
  // dealloc and close as needed when bad data was found
bad_data:
  while (i > 0) delete[] new_data[--i];
  delete[] new_data;
  if (f) fclose(f);
}